

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall soul::AST::ConcreteType::ConcreteType(ConcreteType *this,Context *c,Type *t)

{
  SourceCodeText *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ASTObject_002d4778;
  (this->super_Expression).super_Statement.super_ASTObject.objectType = ConcreteType;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = c->parentScope;
  (this->super_Expression).kind = type;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ConcreteType_002d4e98;
  CVar2 = t->arrayElementCategory;
  bVar3 = t->isRef;
  bVar4 = t->isConstant;
  (this->type).category = t->category;
  (this->type).arrayElementCategory = CVar2;
  (this->type).isRef = bVar3;
  (this->type).isConstant = bVar4;
  (this->type).primitiveType.type = (t->primitiveType).type;
  BVar5 = t->arrayElementBoundingSize;
  (this->type).boundingSize = t->boundingSize;
  (this->type).arrayElementBoundingSize = BVar5;
  (this->type).structure.object = (t->structure).object;
  (t->structure).object = (Structure *)0x0;
  return;
}

Assistant:

ASTObject (ObjectType ot, const Context& c) : objectType (ot), context (c) {}